

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall Lowerer::GenerateFastBrOrCmString(Lowerer *this,Instr *instr)

{
  short sVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  LibraryValue valueType;
  LibraryValue valueType_00;
  Opnd *pOVar7;
  LabelInstr *labelHelper_00;
  BranchInstr *pBVar8;
  undefined4 *puVar9;
  LabelInstr *target;
  Opnd *pOVar10;
  byte local_8a;
  byte local_89;
  RegOpnd *local_88;
  RegOpnd *local_80;
  Instr *local_70;
  Instr *blockEndInstr;
  LibraryValue failureValueType;
  LibraryValue successValueType;
  LabelInstr *labelFallthrough;
  bool isCmNegOp;
  bool isBranch;
  bool isStrict;
  LabelInstr *pLStack_50;
  bool isEqual;
  LabelInstr *labelBranchSuccess;
  LabelInstr *labelBranchFail;
  LabelInstr *labelHelper;
  RegOpnd *local_30;
  RegOpnd *srcReg2;
  RegOpnd *srcReg1;
  Instr *instr_local;
  Lowerer *this_local;
  
  srcReg1 = (RegOpnd *)instr;
  instr_local = (Instr *)this;
  pOVar7 = IR::Instr::GetSrc1(instr);
  bVar5 = IR::Opnd::IsRegOpnd(pOVar7);
  if (bVar5) {
    pOVar7 = IR::Instr::GetSrc1((Instr *)srcReg1);
    local_80 = IR::Opnd::AsRegOpnd(pOVar7);
  }
  else {
    local_80 = (RegOpnd *)0x0;
  }
  srcReg2 = local_80;
  pOVar7 = IR::Instr::GetSrc2((Instr *)srcReg1);
  bVar5 = IR::Opnd::IsRegOpnd(pOVar7);
  if (bVar5) {
    pOVar7 = IR::Instr::GetSrc2((Instr *)srcReg1);
    local_88 = IR::Opnd::AsRegOpnd(pOVar7);
  }
  else {
    local_88 = (RegOpnd *)0x0;
  }
  local_30 = local_88;
  local_89 = 1;
  if ((srcReg2 != (RegOpnd *)0x0) && (local_89 = 1, local_88 != (RegOpnd *)0x0)) {
    bVar5 = IR::Opnd::IsTaggedInt(&srcReg2->super_Opnd);
    local_89 = 1;
    if (!bVar5) {
      bVar5 = IR::Opnd::IsTaggedInt(&local_30->super_Opnd);
      local_89 = 1;
      if (!bVar5) {
        labelHelper._6_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(&srcReg2->super_Opnd);
        bVar5 = ValueType::HasHadStringTag((ValueType *)((long)&labelHelper + 6));
        if (!bVar5) {
          labelHelper._4_2_ =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               IR::Opnd::GetValueType(&local_30->super_Opnd);
          bVar5 = ValueType::IsString((ValueType *)((long)&labelHelper + 4));
          local_89 = 1;
          if (!bVar5) goto LAB_007ccdc5;
        }
        labelHelper._2_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(&local_30->super_Opnd);
        bVar5 = ValueType::HasHadStringTag((ValueType *)((long)&labelHelper + 2));
        local_8a = 0;
        if (!bVar5) {
          labelHelper._0_2_ =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               IR::Opnd::GetValueType(&srcReg2->super_Opnd);
          bVar5 = ValueType::IsString((ValueType *)&labelHelper);
          local_8a = bVar5 ^ 0xff;
        }
        local_89 = local_8a;
      }
    }
  }
LAB_007ccdc5:
  if ((local_89 & 1) != 0) {
    return false;
  }
  labelHelper_00 = IR::LabelInstr::New(Label,this->m_func,true);
  labelBranchSuccess = (LabelInstr *)0x0;
  pLStack_50 = (LabelInstr *)0x0;
  bVar5 = false;
  labelFallthrough._6_1_ = false;
  bVar3 = true;
  bVar4 = false;
  sVar1 = *(short *)&srcReg1[1].m_sym;
  if (sVar1 == 0xc) {
LAB_007ccf0c:
    labelBranchSuccess = IR::LabelInstr::New(Label,this->m_func,false);
    pBVar8 = IR::Instr::AsBranchInstr((Instr *)srcReg1);
    pLStack_50 = IR::BranchInstr::GetTarget(pBVar8);
    IR::Instr::InsertAfter((Instr *)srcReg1,&labelBranchSuccess->super_Instr);
    bVar5 = true;
  }
  else {
    if (sVar1 != 0xd) {
      if (sVar1 == 0x14) {
LAB_007ccf08:
        labelFallthrough._6_1_ = true;
        goto LAB_007ccf0c;
      }
      if (sVar1 != 0x15) {
        if (sVar1 == 0x3b) {
LAB_007ccf98:
          bVar5 = true;
          bVar3 = false;
        }
        else {
          if (sVar1 != 0x40) {
            if (sVar1 == 0x41) {
              labelFallthrough._6_1_ = true;
              goto LAB_007ccf98;
            }
            if (sVar1 != 0x42) {
              if (sVar1 == 0x194) goto LAB_007ccf52;
              if (sVar1 == 0x195) goto LAB_007ccf0c;
              if (sVar1 != 0x196) {
                if (sVar1 != 0x197) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar9 = 1;
                  bVar6 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                     ,0x5eec,"((0))","(0)");
                  if (!bVar6) {
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar9 = 0;
                  goto LAB_007cd026;
                }
                goto LAB_007ccf08;
              }
              goto LAB_007ccf4e;
            }
            labelFallthrough._6_1_ = true;
          }
          bVar5 = false;
          bVar3 = false;
          bVar4 = true;
        }
        goto LAB_007cd026;
      }
LAB_007ccf4e:
      labelFallthrough._6_1_ = true;
    }
LAB_007ccf52:
    pLStack_50 = IR::LabelInstr::New(Label,this->m_func,false);
    pBVar8 = IR::Instr::AsBranchInstr((Instr *)srcReg1);
    labelBranchSuccess = IR::BranchInstr::GetTarget(pBVar8);
    IR::Instr::InsertAfter((Instr *)srcReg1,&pLStack_50->super_Instr);
    bVar5 = false;
  }
LAB_007cd026:
  if (!bVar3) {
    pLStack_50 = IR::LabelInstr::New(Label,this->m_func,false);
    labelBranchSuccess = IR::LabelInstr::New(Label,this->m_func,false);
  }
  GenerateFastStringCheck
            (this,(Instr *)srcReg1,srcReg2,local_30,bVar5,labelFallthrough._6_1_,labelHelper_00,
             pLStack_50,labelBranchSuccess);
  target = IR::LabelInstr::New(Label,this->m_func,false);
  if (!bVar3) {
    valueType = ValueFalse;
    if (!bVar4) {
      valueType = ValueTrue;
    }
    valueType_00 = ValueTrue;
    if (!bVar4) {
      valueType_00 = ValueFalse;
    }
    IR::Instr::InsertBefore((Instr *)srcReg1,&pLStack_50->super_Instr);
    pOVar7 = IR::Instr::GetDst((Instr *)srcReg1);
    pOVar10 = LoadLibraryValueOpnd(this,(Instr *)srcReg1,valueType);
    InsertMove(pOVar7,pOVar10,(Instr *)srcReg1,true);
    InsertBranch(Br,target,(Instr *)srcReg1);
    IR::Instr::InsertBefore((Instr *)srcReg1,&labelBranchSuccess->super_Instr);
    pOVar7 = IR::Instr::GetDst((Instr *)srcReg1);
    pOVar10 = LoadLibraryValueOpnd(this,(Instr *)srcReg1,valueType_00);
    InsertMove(pOVar7,pOVar10,(Instr *)srcReg1,true);
    InsertBranch(Br,target,(Instr *)srcReg1);
  }
  IR::Instr::InsertBefore((Instr *)srcReg1,&labelHelper_00->super_Instr);
  IR::Instr::InsertAfter((Instr *)srcReg1,&target->super_Instr);
  if (bVar5 == false) {
    local_70 = IR::Instr::GetNextBranchOrLabel((Instr *)srcReg1);
  }
  else {
    local_70 = IR::Instr::GetNextBranchOrLabel(&labelHelper_00->super_Instr);
  }
  bVar5 = IR::Instr::IsBranchInstr(local_70);
  if (bVar5) {
    pBVar8 = IR::Instr::AsBranchInstr(local_70);
    pBVar8->m_isHelperToNonHelperBranch = true;
  }
  target->field_0x78 = target->field_0x78 & 0xdf | 0x20;
  return true;
}

Assistant:

bool
Lowerer::GenerateFastBrOrCmString(IR::Instr* instr)
{
    IR::RegOpnd *srcReg1 = instr->GetSrc1()->IsRegOpnd() ? instr->GetSrc1()->AsRegOpnd() : nullptr;
    IR::RegOpnd *srcReg2 = instr->GetSrc2()->IsRegOpnd() ? instr->GetSrc2()->AsRegOpnd() : nullptr;

    if (!srcReg1 ||
        !srcReg2 ||
        srcReg1->IsTaggedInt() ||
        srcReg2->IsTaggedInt() ||
        (!srcReg1->GetValueType().HasHadStringTag() && !srcReg2->GetValueType().IsString()) ||
        (!srcReg2->GetValueType().HasHadStringTag() && !srcReg1->GetValueType().IsString()))
    {
        return false;
    }

    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    IR::LabelInstr *labelBranchFail = nullptr;
    IR::LabelInstr *labelBranchSuccess = nullptr;

    bool isEqual = false;
    bool isStrict = false;
    bool isBranch = true;
    bool isCmNegOp = false;

    switch (instr->m_opcode)
    {
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
        isStrict = true;
    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrNotNeq_A:
        labelBranchFail = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        labelBranchSuccess = instr->AsBranchInstr()->GetTarget();
        instr->InsertAfter(labelBranchFail);
        isEqual = true;
        break;

    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
        isStrict = true;
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrNotEq_A:
        labelBranchSuccess = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        labelBranchFail = instr->AsBranchInstr()->GetTarget();
        instr->InsertAfter(labelBranchSuccess);
        isEqual = false;
        break;

    case Js::OpCode::CmSrEq_A:
        isStrict = true;
    case Js::OpCode::CmEq_A:
        isEqual = true;
        isBranch = false;
        break;

    case Js::OpCode::CmSrNeq_A:
        isStrict = true;
    case Js::OpCode::CmNeq_A:
        isEqual = false;
        isBranch = false;
        isCmNegOp = true;
        break;

    default:
        Assume(UNREACHED);
    }

    if (!isBranch)
    {
        labelBranchSuccess = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        labelBranchFail = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    }

    GenerateFastStringCheck(instr, srcReg1, srcReg2, isEqual, isStrict, labelHelper, labelBranchSuccess, labelBranchFail);

    IR::LabelInstr *labelFallthrough = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

    if (!isBranch)
    {
        const LibraryValue successValueType = !isCmNegOp ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
        const LibraryValue failureValueType = !isCmNegOp ? LibraryValue::ValueFalse : LibraryValue::ValueTrue;

        instr->InsertBefore(labelBranchSuccess);
        InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, successValueType), instr);
        InsertBranch(Js::OpCode::Br, labelFallthrough, instr);

        instr->InsertBefore(labelBranchFail);
        InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, failureValueType), instr);
        InsertBranch(Js::OpCode::Br, labelFallthrough, instr);
    }

    instr->InsertBefore(labelHelper);

    instr->InsertAfter(labelFallthrough);

#if DBG
    // The fast-path for strings assumes the case where 2 strings are equal is rare, and marks that path as 'helper'.
    // This breaks the helper label dbchecks as it can result in non-helper blocks be reachable only from helper blocks.
    // Use m_isHelperToNonHelperBranch and m_noHelperAssert to fix this.
    IR::Instr *blockEndInstr;

    if (isEqual)
    {
        blockEndInstr = labelHelper->GetNextBranchOrLabel();
    }
    else
    {
        blockEndInstr = instr->GetNextBranchOrLabel();
    }

    if (blockEndInstr->IsBranchInstr())
    {
        blockEndInstr->AsBranchInstr()->m_isHelperToNonHelperBranch = true;
    }

    labelFallthrough->m_noHelperAssert = true;
#endif

    return true;
}